

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsseval.c
# Opt level: O2

void GEN(AES_KEY *key,int alpha,int n,uchar **k0,uchar **k1)

{
  ulong *puVar1;
  undefined8 *puVar2;
  uint *puVar3;
  uint uVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  longlong lVar10;
  longlong lVar11;
  undefined8 uVar12;
  undefined1 auVar13 [12];
  long lVar14;
  int iVar15;
  uint uVar16;
  longlong *plVar17;
  ulong uVar18;
  long lVar19;
  uchar *puVar20;
  uchar *puVar21;
  uint uVar22;
  ulong uVar24;
  uchar *puVar25;
  uint uVar26;
  undefined8 *puVar27;
  undefined4 in_register_00000034;
  AES_KEY *pAVar28;
  uint uVar29;
  int *in_R9;
  ulong uVar30;
  long lVar31;
  size_t __size;
  uint uVar32;
  ulong uVar33;
  bool bVar34;
  undefined8 extraout_XMM0_Qa;
  ulong uVar35;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  ulong uVar36;
  ulong uVar37;
  ulong uVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  ulong uVar44;
  block input;
  block input_00;
  block input_01;
  undefined8 uStack_118;
  block s0 [2];
  block s1 [2];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_84;
  uint local_80;
  int t0 [2];
  int t1 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  ulong uVar23;
  
  lVar19 = CONCAT44(in_register_00000034,alpha);
  uVar22 = n - 7;
  uVar23 = (ulong)uVar22;
  uVar33 = (ulong)(n - 6);
  plVar17 = s0[uVar33 * -2 + -1] + 1;
  uVar30 = uVar33 * 8 + 0xf & 0xfffffffffffffff0;
  lVar14 = uVar23 * -0x10 - uVar30;
  puVar27 = (undefined8 *)((long)plVar17 + (lVar14 - (uVar23 * 8 + 0xf & 0xfffffffffffffff0)));
  puVar27[-1] = 0x1013b3;
  pAVar28 = key;
  dpf_random_block();
  uStack_90 = (uint)extraout_XMM0_Qb;
  uStack_8c = (uint)((ulong)extraout_XMM0_Qb >> 0x20);
  puVar27[-1] = 0x1013c0;
  dpf_random_block();
  auVar13._8_4_ = uStack_90;
  auVar13._0_8_ = extraout_XMM0_Qa;
  auVar43._12_4_ = uStack_8c;
  auVar43._0_12_ = auVar13;
  uVar29 = (uint)extraout_XMM0_Qa & 1;
  uVar16 = uVar29 ^ 1;
  *(uint *)((long)s0 + (uVar33 * -0x20 - uVar30) + -4) = uVar16;
  if ((auVar13 & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
    auVar43 = auVar43 ^ _DAT_00103010;
  }
  *(undefined1 (*) [16])plVar17 = auVar43;
  auVar43 = extraout_XMM0;
  if ((extraout_XMM0 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar43 = extraout_XMM0 ^ _DAT_00103010;
  }
  *(undefined1 (*) [16])(s0[uVar33 * -2] + 1) = auVar43;
  lVar31 = 0;
  uVar24 = 0;
  if (0 < (int)uVar22) {
    uVar24 = uVar23;
  }
  uVar32 = n;
  for (; uVar32 = uVar32 - 1, uVar24 * 8 != lVar31; lVar31 = lVar31 + 8) {
    puVar27[-1] = 0x10149e;
    input[1] = (longlong)(s0[0] + 1);
    input[0] = (longlong)&uStack_118;
    PRG(key,input,(block *)&local_84,(block *)&local_80,in_R9,(int *)*puVar27);
    puVar27[-1] = 0x1014c6;
    input_00[1] = (longlong)(s1[0] + 1);
    input_00[0] = (longlong)(s0[1] + 1);
    PRG(key,input_00,(block *)t0,(block *)(t0 + 1),in_R9,(int *)*puVar27);
    iVar15 = t0[0];
    uVar4 = local_84;
    lVar11 = s1[1][0];
    lVar10 = s1[0][1];
    uVar36 = s1[0][0];
    uVar35 = s0[1][1];
    bVar34 = ((uint)alpha >> (uVar32 & 0x1f) & 1) != 0;
    uVar37 = s1[0][1];
    uVar42 = s1[1][0];
    uVar23 = s0[1][0];
    uVar44 = s0[0][1];
    if (bVar34) {
      uVar37 = s0[1][1];
      uVar42 = s1[0][0];
      uVar23 = s0[0][0];
      uVar44 = uStack_118;
    }
    uVar37 = uVar37 ^ uVar44;
    uVar42 = uVar42 ^ uVar23;
    puVar1 = (ulong *)((long)plVar17 + lVar31 * 2 + lVar14);
    *puVar1 = uVar37;
    puVar1[1] = uVar42;
    uVar23 = uStack_118;
    uVar44 = s0[0][0];
    if (bVar34) {
      uVar23 = s0[0][1];
      uVar44 = s0[1][0];
    }
    uVar18 = (ulong)bVar34;
    *(uint *)((long)puVar27 + lVar31) = local_84 ^ t0[0] ^ (uint)bVar34 ^ 1;
    uVar26 = t0[1];
    uVar6 = local_80;
    *(uint *)((long)puVar27 + lVar31 + 4) = local_80 ^ t0[1] ^ (uint)bVar34;
    lVar19 = (long)puVar27 + uVar18 * 4;
    if (uVar29 == 1) {
      if (uVar18 == 0) {
        uVar6 = uVar4;
      }
      uVar23 = uVar23 ^ uVar37;
      uVar44 = uVar44 ^ uVar42;
      uVar29 = uVar6 ^ *(uint *)(lVar31 + lVar19);
    }
    else {
      uVar29 = uVar6;
      if (uVar18 == 0) {
        uVar29 = uVar4;
      }
    }
    puVar1 = (ulong *)((long)s1[uVar33 * -2 + -1] + lVar31 * 4 + 8);
    *puVar1 = uVar23;
    puVar1[1] = uVar44;
    *(uint *)((long)plVar17 + lVar31 + (8 - uVar30)) = uVar29;
    uVar4 = *(uint *)((long)plVar17 + lVar31 + (4 - uVar30));
    pAVar28 = (AES_KEY *)(ulong)uVar4;
    if (uVar18 != 0) {
      uVar35 = lVar10;
      uVar36 = lVar11;
    }
    if (uVar4 == 1) {
      uVar35 = uVar35 ^ uVar37;
      uVar36 = uVar36 ^ uVar42;
      if (uVar18 == 0) {
        uVar26 = iVar15;
      }
      uVar26 = uVar26 ^ *(uint *)(lVar31 + lVar19);
    }
    else if (uVar18 == 0) {
      uVar26 = iVar15;
    }
    puVar1 = (ulong *)((long)s1[uVar33 * -2] + lVar31 * 4 + 8);
    *puVar1 = uVar35;
    puVar1[1] = uVar36;
    *(uint *)((long)plVar17 + lVar31 + (0xc - uVar30)) = uVar26;
  }
  auVar39 = ZEXT416(1);
  if ((alpha & 0x40U) != 0) {
    auVar39 = _DAT_00103020;
  }
  if ((alpha & 0x20U) != 0) {
    lVar31 = auVar39._8_8_;
    auVar39._0_8_ = auVar39._0_8_ << 0x20;
    auVar39._8_8_ = lVar31 << 0x20;
  }
  if ((alpha & 0x10U) != 0) {
    lVar31 = auVar39._8_8_;
    uVar23 = auVar39._0_8_;
    auVar39._0_8_ = uVar23 << 0x10;
    auVar39._8_8_ = lVar31 << 0x10 | uVar23 >> 0x30;
  }
  if ((alpha & 8U) != 0) {
    lVar31 = auVar39._8_8_;
    uVar23 = auVar39._0_8_;
    auVar39._0_8_ = uVar23 << 8;
    auVar39._8_8_ = lVar31 << 8 | uVar23 >> 0x38;
  }
  if ((alpha & 4U) != 0) {
    auVar38._0_8_ = auVar39._0_8_ << 4;
    auVar38._8_8_ = auVar39._8_8_ << 4;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar39._0_8_ >> 0x3c;
    auVar39 = auVar38 | auVar7 << 0x40;
  }
  if ((alpha & 2U) != 0) {
    auVar40._0_8_ = auVar39._0_8_ << 2;
    auVar40._8_8_ = auVar39._8_8_ << 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = auVar39._0_8_ >> 0x3e;
    auVar39 = auVar40 | auVar8 << 0x40;
  }
  if ((alpha & 1U) != 0) {
    auVar41._8_8_ = auVar39._8_8_ * 2;
    auVar41._0_8_ = auVar39._0_8_ * 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar39._0_8_ >> 0x3f;
    auVar39 = auVar41 | auVar9 << 0x40;
  }
  puVar27[-1] = 0x101667;
  input_01[1] = lVar19;
  input_01[0] = (longlong)pAVar28;
  dpf_cb(input_01);
  lVar19 = (long)(int)uVar22;
  lVar31 = lVar19 * 0x12;
  lVar10 = plVar17[lVar19 * 4];
  uVar5 = (plVar17 + lVar19 * 4)[1];
  lVar11 = s0[uVar33 * -2 + lVar19 * 2][1];
  uVar12 = (s0[uVar33 * -2 + lVar19 * 2] + 1)[1];
  local_98 = (uint)lVar11;
  uStack_94 = (uint)((ulong)lVar11 >> 0x20);
  uStack_90 = (uint)uVar12;
  uStack_8c = (uint)((ulong)uVar12 >> 0x20);
  __size = (size_t)((int)lVar31 + 0x22);
  puVar27[-1] = 0x10169d;
  puVar20 = (uchar *)malloc(__size);
  puVar27[-1] = 0x1016a8;
  puVar21 = (uchar *)malloc(__size);
  if ((puVar20 != (uchar *)0x0) && (puVar21 != (uchar *)0x0)) {
    *puVar20 = (uchar)n;
    lVar11 = s0[uVar33 * -2][0];
    *(longlong *)(puVar20 + 1) = *plVar17;
    *(longlong *)(puVar20 + 9) = lVar11;
    puVar20[0x11] = (byte)extraout_XMM0_Qa & 1;
    puVar25 = puVar20 + 0x23;
    for (lVar19 = 0; uVar24 << 3 != lVar19; lVar19 = lVar19 + 8) {
      puVar2 = (undefined8 *)((long)plVar17 + lVar19 * 2 + lVar14);
      uVar12 = puVar2[1];
      *(undefined8 *)(puVar25 + -0x11) = *puVar2;
      *(undefined8 *)(puVar25 + -9) = uVar12;
      puVar25[-1] = *(uchar *)((long)puVar27 + lVar19);
      *puVar25 = *(uchar *)((long)puVar27 + lVar19 + 4);
      puVar25 = puVar25 + 0x12;
    }
    local_68._0_4_ = (uint)lVar10;
    local_68._4_4_ = (uint)((ulong)lVar10 >> 0x20);
    uStack_60._0_4_ = (uint)uVar5;
    uStack_60._4_4_ = (uint)((ulong)uVar5 >> 0x20);
    local_58 = auVar39._0_4_;
    uStack_54 = auVar39._4_4_;
    uStack_50 = auVar39._8_4_;
    uStack_4c = auVar39._12_4_;
    local_58 = (uint)local_68 ^ local_98 ^ local_58;
    uStack_54 = local_68._4_4_ ^ uStack_94 ^ uStack_54;
    uStack_50 = (uint)uStack_60 ^ uStack_90 ^ uStack_50;
    uStack_4c = uStack_60._4_4_ ^ uStack_8c ^ uStack_4c;
    local_68 = CONCAT44(uStack_54,local_58) ^ 1;
    uStack_60 = CONCAT44(uStack_4c,uStack_50);
    puVar3 = (uint *)(puVar20 + lVar31 + 0x12);
    *puVar3 = local_58 ^ 1;
    puVar3[1] = uStack_54;
    puVar3[2] = uStack_50;
    puVar3[3] = uStack_4c;
    *puVar21 = (uchar)n;
    puVar27[-1] = 0x101757;
    memcpy(puVar21 + 0x12,puVar20 + 0x12,(long)(int)lVar31);
    lVar10 = s0[uVar33 * -2 + 1][0];
    *(longlong *)(puVar21 + 1) = s0[uVar33 * -2][1];
    *(longlong *)(puVar21 + 9) = lVar10;
    puVar21[0x11] = (uchar)uVar16;
    *(ulong *)(puVar21 + lVar31 + 0x12) = local_68;
    *(ulong *)((long)(puVar21 + lVar31 + 0x12) + 8) = uStack_60;
    *k0 = puVar20;
    *k1 = puVar21;
    return;
  }
  puVar27[-1] = 0x1017a6;
  puts("Memory allocation failed");
  puVar27[-1] = 1;
  uVar5 = puVar27[-1];
  puVar27[-1] = EVAL;
  exit((int)uVar5);
}

Assistant:

void GEN(AES_KEY *key, int alpha, int n, unsigned char** k0, unsigned char **k1){
	int maxlayer = n - 7;
	//int maxlayer = n;

	block s[maxlayer + 1][2];
	int t[maxlayer + 1 ][2];
	block sCW[maxlayer];
	int tCW[maxlayer][2];

	s[0][0] = dpf_random_block();
	s[0][1] = dpf_random_block();
	t[0][0] = dpf_lsb(s[0][0]);
	t[0][1] = t[0][0] ^ 1;
	s[0][0] = dpf_set_lsb_zero(s[0][0]);
	s[0][1] = dpf_set_lsb_zero(s[0][1]);

	int i;
	block s0[2], s1[2]; // 0=L,1=R
	#define LEFT 0
	#define RIGHT 1
	int t0[2], t1[2];
	for(i = 1; i<= maxlayer; i++){
		PRG(key, s[i-1][0], &s0[LEFT], &s0[RIGHT], &t0[LEFT], &t0[RIGHT]);
		PRG(key, s[i-1][1], &s1[LEFT], &s1[RIGHT], &t1[LEFT], &t1[RIGHT]);

		int keep, lose;
		int alphabit = getbit(alpha, n, i);
		if(alphabit == 0){
			keep = LEFT;
			lose = RIGHT;
		}else{
			keep = RIGHT;
			lose = LEFT;
		}

		sCW[i-1] = dpf_xor(s0[lose], s1[lose]);

		tCW[i-1][LEFT] = t0[LEFT] ^ t1[LEFT] ^ alphabit ^ 1;
		tCW[i-1][RIGHT] = t0[RIGHT] ^ t1[RIGHT] ^ alphabit;

		if(t[i-1][0] == 1){
			s[i][0] = dpf_xor(s0[keep], sCW[i-1]);
			t[i][0] = t0[keep] ^ tCW[i-1][keep];
		}else{
			s[i][0] = s0[keep];
			t[i][0] = t0[keep];
		}

		if(t[i-1][1] == 1){
			s[i][1] = dpf_xor(s1[keep], sCW[i-1]);
			t[i][1] = t1[keep] ^ tCW[i-1][keep];
		}else{
			s[i][1] = s1[keep];
			t[i][1] = t1[keep];
		}
	}

	block finalblock;
	finalblock = dpf_zero_block();
	finalblock = dpf_reverse_lsb(finalblock);

	char shift = (alpha) & 127;
	if(shift & 64){
		finalblock = dpf_left_shirt(finalblock, 64);
	}
	if(shift & 32){
		finalblock = dpf_left_shirt(finalblock, 32);
	}
	if(shift & 16){
		finalblock = dpf_left_shirt(finalblock, 16);
	}
	if(shift & 8){
		finalblock = dpf_left_shirt(finalblock, 8);
	}
	if(shift & 4){
		finalblock = dpf_left_shirt(finalblock, 4);
	}
	if(shift & 2){
		finalblock = dpf_left_shirt(finalblock, 2);
	}
	if(shift & 1){
		finalblock = dpf_left_shirt(finalblock, 1);
	}
	dpf_cb(finalblock);
	finalblock = dpf_reverse_lsb(finalblock);

	finalblock = dpf_xor(finalblock, s[maxlayer][0]);
	finalblock = dpf_xor(finalblock, s[maxlayer][1]);

	unsigned char *buff0;
	unsigned char *buff1;
	buff0 = (unsigned char*) malloc(1 + 16 + 1 + 18 * maxlayer + 16);
	buff1 = (unsigned char*) malloc(1 + 16 + 1 + 18 * maxlayer + 16);

	if(buff0 == NULL || buff1 == NULL){
		printf("Memory allocation failed\n");
		exit(1);
	}

	buff0[0] = n;
	memcpy(&buff0[1], &s[0][0], 16);
	buff0[17] = t[0][0];
	for(i = 1; i <= maxlayer; i++){
		memcpy(&buff0[18 * i], &sCW[i-1], 16);
		buff0[18 * i + 16] = tCW[i-1][0];
		buff0[18 * i + 17] = tCW[i-1][1]; 
	}
	memcpy(&buff0[18 * maxlayer + 18], &finalblock, 16); 

	buff1[0] = n;
	memcpy(&buff1[18], &buff0[18], 18 * (maxlayer));
	memcpy(&buff1[1], &s[0][1], 16);
	buff1[17] = t[0][1];
	memcpy(&buff1[18 * maxlayer + 18], &finalblock, 16);

	*k0 = buff0;
	*k1 = buff1;
}